

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

ssize_t __thiscall
asmjit::v1_14::JitAllocator::write(JitAllocator *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  undefined8 *puVar2;
  ulong in_R8;
  CachePolicy in_R9D;
  ProtectJitReadWriteScope writeScope;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  sVar1 = 2;
  if (puVar2[3] != 0) {
    writeScope._size = puVar2[2];
    if ((__buf <= writeScope._size) && (in_R8 <= writeScope._size - (long)__buf)) {
      if (in_R8 == 0) {
        sVar1 = 0;
      }
      else {
        writeScope._policy = (*(uint *)(puVar2 + 4) & 1) + kFlushAfterWrite;
        if (in_R9D != kDefault) {
          writeScope._policy = in_R9D;
        }
        writeScope._rxPtr = (void *)*puVar2;
        sVar1 = 0;
        VirtMem::protectJitMemory(kReadWrite);
        memcpy((void *)((long)__buf + puVar2[1]),(void *)__n,in_R8);
        VirtMem::ProtectJitReadWriteScope::~ProtectJitReadWriteScope(&writeScope);
      }
    }
  }
  return sVar1;
}

Assistant:

Error JitAllocator::write(Span& span, size_t offset, const void* src, size_t size, VirtMem::CachePolicy policy) noexcept {
  if (ASMJIT_UNLIKELY(span._block == nullptr || offset > span.size() || span.size() - offset < size))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(size == 0))
    return kErrorOk;

  if (policy == VirtMem::CachePolicy::kDefault)
    policy = JitAllocator_defaultPolicyForSpan(span);

  VirtMem::ProtectJitReadWriteScope writeScope(span.rx(), span.size(), policy);
  memcpy(static_cast<uint8_t*>(span.rw()) + offset, src, size);
  return kErrorOk;
}